

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.h
# Opt level: O2

Entity __thiscall entityx::EntityManager::create_from_copy(EntityManager *this,Entity original)

{
  long *plVar1;
  bool bVar2;
  size_t i;
  ulong __position;
  Entity EVar3;
  bitset<64UL> mask;
  bitset<64UL> local_38;
  
  EVar3 = create(this);
  local_38.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)entityx::Entity::component_mask();
  for (__position = 0; __position < (ulong)(*(long *)(this + 0x38) - *(long *)(this + 0x30) >> 3);
      __position = __position + 1) {
    plVar1 = *(long **)(*(long *)(this + 0x30) + __position * 8);
    if (plVar1 != (long *)0x0) {
      bVar2 = Catch::clara::std::bitset<64UL>::test(&local_38,__position);
      if (bVar2) {
        (**(code **)(*plVar1 + 0x18))
                  (plVar1,original.manager_,original.id_.id_.id_,EVar3.manager_,EVar3.id_.id_.id_);
      }
    }
  }
  return EVar3;
}

Assistant:

Entity create_from_copy(Entity original) {
    assert(original.valid());
    auto clone = create();
    auto mask = original.component_mask();
    for (size_t i = 0; i < component_helpers_.size(); i++) {
      BaseComponentHelper *helper = component_helpers_[i];
      if (helper && mask.test(i))
        helper->copy_component_to(original, clone);
    }
    return clone;
  }